

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O2

void __thiscall jpge::jpeg_encoder::code_block(jpeg_encoder *this,int component_num)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  sample_array_t *psVar7;
  int32 c;
  int iVar8;
  sample_array_t *psVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  
  psVar7 = this->m_sample_array;
  psVar9 = psVar7;
  for (iVar8 = 7; -1 < iVar8; iVar8 = iVar8 + -1) {
    iVar10 = psVar9[7] + *psVar9;
    sVar3 = (short)*psVar9 - (short)psVar9[7];
    iVar12 = psVar9[1] + psVar9[6];
    sVar5 = (short)psVar9[1] - (short)psVar9[6];
    iVar14 = psVar9[5] + psVar9[2];
    sVar4 = (short)psVar9[2] - (short)psVar9[5];
    iVar13 = psVar9[4] + psVar9[3];
    sVar6 = (short)psVar9[3] - (short)psVar9[4];
    iVar11 = iVar10 + iVar13;
    sVar1 = (short)iVar10 - (short)iVar13;
    iVar13 = iVar12 + iVar14;
    sVar2 = (short)iVar12 - (short)iVar14;
    iVar15 = (short)(sVar3 + sVar4 + sVar5 + sVar6) * 0x25a1;
    iVar10 = (short)(sVar5 + sVar6) * -0x3ec5 + iVar15;
    iVar15 = (short)(sVar3 + sVar4) * -0xc7c + iVar15;
    *psVar9 = (iVar11 + iVar13) * 4;
    iVar16 = (short)(sVar3 + sVar6) * -0x1ccd;
    psVar9[1] = iVar16 + sVar3 * 0x300b + 0x400 + iVar15 >> 0xb;
    iVar14 = (short)(sVar1 + sVar2) * 0x1151;
    psVar9[2] = sVar1 * 0x187e + iVar14 + 0x400 >> 0xb;
    iVar12 = (short)(sVar5 + sVar4) * -0x5203;
    psVar9[3] = sVar5 * 0x6254 + iVar12 + 0x400 + iVar10 >> 0xb;
    psVar9[4] = (iVar11 - iVar13) * 4;
    psVar9[5] = sVar4 * 0x41b3 + iVar12 + 0x400 + iVar15 >> 0xb;
    psVar9[6] = sVar2 * -0x3b21 + iVar14 + 0x400 >> 0xb;
    psVar9[7] = sVar6 * 0x98e + iVar16 + 0x400 + iVar10 >> 0xb;
    psVar9 = psVar9 + 8;
  }
  for (iVar8 = 7; -1 < iVar8; iVar8 = iVar8 + -1) {
    iVar10 = psVar7[0x38] + *psVar7;
    sVar3 = (short)*psVar7 - (short)psVar7[0x38];
    iVar12 = psVar7[0x30] + psVar7[8];
    sVar5 = (short)psVar7[8] - (short)psVar7[0x30];
    iVar14 = psVar7[0x28] + psVar7[0x10];
    sVar4 = (short)psVar7[0x10] - (short)psVar7[0x28];
    iVar13 = psVar7[0x20] + psVar7[0x18];
    sVar6 = (short)psVar7[0x18] - (short)psVar7[0x20];
    iVar11 = iVar10 + iVar13;
    sVar1 = (short)iVar10 - (short)iVar13;
    iVar13 = iVar12 + iVar14;
    sVar2 = (short)iVar12 - (short)iVar14;
    iVar14 = (short)(sVar3 + sVar4 + sVar5 + sVar6) * 0x25a1;
    iVar10 = (short)(sVar5 + sVar6) * -0x3ec5 + iVar14;
    iVar14 = (short)(sVar3 + sVar4) * -0xc7c + iVar14;
    *psVar7 = iVar13 + iVar11 + 0x10 >> 5;
    iVar16 = (short)(sVar3 + sVar6) * -0x1ccd;
    psVar7[8] = iVar16 + sVar3 * 0x300b + 0x20000 + iVar14 >> 0x12;
    iVar15 = (short)(sVar1 + sVar2) * 0x1151;
    psVar7[0x10] = sVar1 * 0x187e + iVar15 + 0x20000 >> 0x12;
    iVar12 = (short)(sVar5 + sVar4) * -0x5203;
    psVar7[0x18] = sVar5 * 0x6254 + iVar12 + 0x20000 + iVar10 >> 0x12;
    psVar7[0x20] = (iVar11 - iVar13) + 0x10 >> 5;
    psVar7[0x28] = sVar4 * 0x41b3 + iVar12 + 0x20000 + iVar14 >> 0x12;
    psVar7[0x30] = sVar2 * -0x3b21 + iVar15 + 0x20000 >> 0x12;
    psVar7[0x38] = sVar6 * 0x98e + iVar16 + 0x20000 + iVar10 >> 0x12;
    psVar7 = psVar7 + 1;
  }
  load_quantized_coefficients(this,component_num);
  if (this->m_pass_num == '\x01') {
    code_coefficients_pass_one(this,component_num);
    return;
  }
  code_coefficients_pass_two(this,component_num);
  return;
}

Assistant:

void jpeg_encoder::code_block(int component_num)
{
  DCT2D(m_sample_array);
  load_quantized_coefficients(component_num);
  if (m_pass_num == 1)
    code_coefficients_pass_one(component_num);
  else
    code_coefficients_pass_two(component_num);
}